

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-overlay-page.cc
# Opt level: O0

int main(int argc,char **argv)

{
  exception *e;
  char *outfile;
  char *stampfile;
  char *infile;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc != 4) {
    usage();
  }
  stamp_page(argv[1],argv[2],argv[3]);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 4) {
        usage();
    }
    char const* infile = argv[1];
    char const* stampfile = argv[2];
    char const* outfile = argv[3];

    try {
        stamp_page(infile, stampfile, outfile);
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }
    return 0;
}